

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

int __thiscall Centaurus::Grammar<char>::parse(Grammar<char> *this,char *filename,int machine_id)

{
  bool bVar1;
  wchar_t wVar2;
  StreamException *pSVar3;
  wstring *__n;
  allocator local_3b1;
  Grammar<char> *local_3b0;
  wstring *local_3a8;
  char *local_3a0;
  vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_> *local_398;
  _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<char>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<char>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_390;
  Identifier *local_388;
  Encoder enc;
  wstring grammar_str;
  string local_358;
  Stream stream;
  string local_2f8;
  wstring wide_path;
  ATNMachine<char> atn;
  Identifier id;
  wifstream grammar_file;
  undefined8 auStack_150 [36];
  
  local_3b0 = this;
  local_3a0 = filename;
  std::wifstream::wifstream(&grammar_file,filename,_S_in);
  grammar_str._M_dataplus._M_p = (pointer)&grammar_str.field_2;
  std::__cxx11::wstring::_M_construct<std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
            ((wstring *)&grammar_str,
             *(undefined8 *)((long)auStack_150 + *(long *)(_grammar_file + -0x18)),
             0xffffffffffffffff,0,0xffffffff);
  Stream::Stream(&stream,&grammar_str);
  __n = &(local_3b0->m_root_id).m_id;
  local_390 = (_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<char>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<char>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&local_3b0->m_networks;
  local_398 = &local_3b0->m_identifiers;
  local_388 = &local_3b0->m_grammar_name;
  local_3a8 = (wstring *)__n;
  do {
    wVar2 = Stream::skip_whitespace(&stream);
    if (wVar2 == L'\0') {
      Stream::~Stream(&stream);
      std::__cxx11::wstring::~wstring((wstring *)&grammar_str);
      std::wifstream::~wifstream(&grammar_file);
      return machine_id;
    }
    if (0xffff < machine_id) {
      pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::toomany(pSVar3,&stream,0xffff);
      __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
    }
    Identifier::Identifier(&id,&stream);
    bVar1 = Identifier::operator==(&id,L"grammar");
    if (bVar1) {
      Stream::skip_whitespace(&stream);
      Identifier::parse(local_388,&stream);
      wVar2 = Stream::skip_whitespace(&stream);
      if (wVar2 != L';') {
        pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(pSVar3,&stream,wVar2);
        __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
      }
      Stream::get(&stream);
    }
    else {
      bVar1 = Identifier::operator==(&id,L"include");
      if (bVar1) {
        wVar2 = Stream::skip_whitespace(&stream);
        if (wVar2 != L'\"') {
          pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
          Stream::unexpected(pSVar3,&stream,wVar2);
          __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
        }
        Stream::get(&stream);
        wide_path._M_dataplus._M_p = (pointer)&wide_path.field_2;
        wide_path._M_string_length = 0;
        wide_path.field_2._M_local_buf[0] = L'\0';
        while( true ) {
          wVar2 = Stream::get(&stream);
          if (wVar2 == L'\"') break;
          std::__cxx11::wstring::push_back
                    ((wchar_t)(pair<Centaurus::Identifier,_Centaurus::ATNMachine<char>_> *)
                              &wide_path);
        }
        wVar2 = Stream::skip_whitespace(&stream);
        if (wVar2 != L';') {
          pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
          Stream::unexpected(pSVar3,&stream,wVar2);
          __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
        }
        Stream::get(&stream);
        Encoder::Encoder(&enc);
        std::__cxx11::string::string((string *)&local_358,local_3a0,&local_3b1);
        Encoder::wcstombs((Encoder *)&local_2f8,(char *)&enc,(wchar_t *)&wide_path,(size_t)__n);
        anon_unknown.dwarf_256cbf::make_include_path((string *)&atn,&local_358,&local_2f8);
        machine_id = parse(local_3b0,(string *)&atn,machine_id);
        std::__cxx11::string::~string((string *)&atn);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::wstring::~wstring((wstring *)&wide_path);
      }
      else {
        ATNMachine<char>::ATNMachine(&atn,machine_id,&stream);
        if ((local_3b0->m_root_id).m_id._M_string_length == 0) {
          std::__cxx11::wstring::_M_assign(local_3a8);
        }
        std::pair<Centaurus::Identifier,_Centaurus::ATNMachine<char>_>::
        pair<Centaurus::Identifier_&,_Centaurus::ATNMachine<char>,_true>
                  ((pair<Centaurus::Identifier,_Centaurus::ATNMachine<char>_> *)&wide_path,&id,&atn)
        ;
        std::
        _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<char>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<char>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<Centaurus::Identifier,Centaurus::ATNMachine<char>>>
                  (local_390,(pair<Centaurus::Identifier,_Centaurus::ATNMachine<char>_> *)&wide_path
                  );
        std::pair<Centaurus::Identifier,_Centaurus::ATNMachine<char>_>::~pair
                  ((pair<Centaurus::Identifier,_Centaurus::ATNMachine<char>_> *)&wide_path);
        std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::push_back
                  (local_398,&id);
        machine_id = machine_id + 1;
        ATNMachine<char>::~ATNMachine(&atn);
      }
    }
    Identifier::~Identifier(&id);
  } while( true );
}

Assistant:

int Grammar<TCHAR>::parse(const char *filename, int machine_id)
{
    std::wifstream grammar_file(filename, std::ios::in);

    std::wstring grammar_str(std::istreambuf_iterator<wchar_t>(grammar_file), {});

    Stream stream(std::move(grammar_str));

    while (1)
    {
        wchar_t ch = stream.skip_whitespace();

        if (ch == L'\0')
            break;

        if (machine_id >= 65536)
            throw stream.toomany(65535);

        Identifier id(stream);

        if (id == L"grammar")
        {
            stream.skip_whitespace();

            m_grammar_name.parse(stream);

            wchar_t ch = stream.skip_whitespace();

            if (ch != L';')
                throw stream.unexpected(ch);
            stream.discard();
        }
        /*else if (id == L"options")
        {
            GrammarOptions options(stream);
        }
		else if (id == L"fragment")
		{
			Identifier frag_id(stream);

			ATNMachine<TCHAR> atn(-1, stream);

			fragments.emplace(frag_id, std::move(atn));
		}*/
        else if (id == L"include")
        {
            wchar_t ch = stream.skip_whitespace();

            if (ch != L'"')
                throw stream.unexpected(ch);
            stream.discard();

            std::wstring wide_path;

            for (ch = stream.get(); ch != L'"'; ch = stream.get())
            {
                wide_path.push_back(ch);
            }

            ch = stream.skip_whitespace();
            if (ch != L';')
                throw stream.unexpected(ch);
            stream.discard();

            Encoder enc{};

            machine_id = parse(make_include_path(filename, enc.wcstombs(wide_path)), machine_id);
        }
        else
        {
            ATNMachine<TCHAR> atn(machine_id++, stream);

            if (m_root_id.str().empty())
                m_root_id = id;

            m_networks.insert(std::pair<Identifier, ATNMachine<TCHAR> >(id, std::move(atn)));

            m_identifiers.push_back(id);
        }

        //m_networks.emplace(Identifier(stream), ATN<TCHAR>(stream));
    }
    return machine_id;
}